

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleFileMuxer.cpp
# Opt level: O1

int __thiscall SingleFileMuxer::close(SingleFileMuxer *this,int __fd)

{
  File *this_00;
  long *plVar1;
  char cVar2;
  int iVar3;
  ssize_t sVar4;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  undefined4 *puVar7;
  size_t __n;
  _Rb_tree_header *p_Var8;
  undefined8 unaff_RBP;
  File *pFVar9;
  bool bVar10;
  string newName;
  ostringstream ss;
  undefined1 local_1e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  undefined8 local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  ostringstream local_1a8 [376];
  
  pFVar9 = (File *)(ulong)(uint)__fd;
  p_Var5 = (this->m_streamInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(this->m_streamInfo)._M_t._M_impl.super__Rb_tree_header;
  bVar10 = (_Rb_tree_header *)p_Var5 == p_Var8;
  if (!bVar10) {
    this_00 = (File *)p_Var5[1]._M_parent;
    iVar3 = File::close(this_00,__fd);
    cVar2 = (char)iVar3;
    while (cVar2 != '\0') {
      if (0 < *(int *)((long)&this_00[2].super_AbstractOutputStream.super_AbstractStream.
                              _vptr_AbstractStream + 4)) {
        __n = 0;
        iVar3 = File::open(this_00,(char *)this_00[1].super_AbstractOutputStream.
                                           super_AbstractStream._vptr_AbstractStream,6);
        if ((char)iVar3 == '\0') break;
        pFVar9 = (File *)this_00[1].m_pos;
        sVar4 = File::write(this_00,(int)pFVar9,
                            (void *)(ulong)*(uint *)((long)&this_00[2].super_AbstractOutputStream.
                                                            super_AbstractStream.
                                                            _vptr_AbstractStream + 4),__n);
        if (((int)sVar4 == 0) ||
           (((plVar1 = (long *)this_00[2].m_name._M_dataplus._M_p, plVar1 != (long *)0x0 &&
             (pFVar9 = this_00, cVar2 = (**(code **)(*plVar1 + 0x70))(), cVar2 == '\0')) ||
            (iVar3 = File::close(this_00,(int)pFVar9), (char)iVar3 == '\0')))) break;
        iVar3 = *(int *)&this_00[2].super_AbstractOutputStream.super_AbstractStream.
                         _vptr_AbstractStream;
        if (1 < iVar3) {
          getNewName((string *)local_1e8,(string *)(this_00 + 1),iVar3);
          deleteFile((string *)local_1e8);
          pFVar9 = (File *)local_1e8._0_8_;
          iVar3 = rename(((_Alloc_hider *)&this_00[1].super_AbstractOutputStream)->_M_p,
                         (char *)local_1e8._0_8_);
          if (iVar3 != 0) {
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Can\'t rename file ",0x12);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,
                                (char *)this_00[1].super_AbstractOutputStream.super_AbstractStream.
                                        _vptr_AbstractStream,(long)this_00[1].m_impl);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," to ",4);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,(char *)local_1e8._0_8_,local_1e8._8_8_);
            puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            *puVar7 = 3;
            *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
            if (local_1c8 == &local_1b8) {
              puVar7[6] = local_1b8._M_allocated_capacity._0_4_;
              puVar7[7] = local_1b8._M_allocated_capacity._4_4_;
              puVar7[8] = local_1b8._8_4_;
              puVar7[9] = local_1b8._12_4_;
            }
            else {
              *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)(puVar7 + 2) = local_1c8;
              *(ulong *)(puVar7 + 6) =
                   CONCAT44(local_1b8._M_allocated_capacity._4_4_,
                            local_1b8._M_allocated_capacity._0_4_);
            }
            *(undefined8 *)(puVar7 + 4) = local_1c0;
            local_1c0 = 0;
            local_1b8._M_allocated_capacity._0_4_ =
                 local_1b8._M_allocated_capacity._0_4_ & 0xffffff00;
            local_1c8 = &local_1b8;
            __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
          if ((File *)local_1e8._0_8_ != (File *)(local_1e8 + 0x10)) {
            pFVar9 = (File *)(local_1e8._16_8_ + 1);
            operator_delete((void *)local_1e8._0_8_,(ulong)pFVar9);
          }
        }
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      bVar10 = (_Rb_tree_header *)p_Var5 == p_Var8;
      if (bVar10) break;
      this_00 = (File *)p_Var5[1]._M_parent;
      iVar3 = File::close(this_00,(int)pFVar9);
      cVar2 = (char)iVar3;
    }
  }
  return (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),bVar10);
}

Assistant:

bool SingleFileMuxer::close()
{
    for (const auto& [fst, snd] : m_streamInfo)
    {
        StreamInfo* streamInfo = snd;
        if (!streamInfo->m_file.close())
            return false;
        if (streamInfo->m_bufLen > 0)
        {
            if (!streamInfo->m_file.open(streamInfo->m_fileName.c_str(), File::ofWrite + File::ofAppend))
                return false;
            if (!streamInfo->m_file.write(streamInfo->m_buffer, streamInfo->m_bufLen))
                return false;
            if (streamInfo->m_codecReader)
                if (!streamInfo->m_codecReader->beforeFileCloseEvent(streamInfo->m_file))
                    return false;
            if (!streamInfo->m_file.close())
                return false;

            if (streamInfo->m_part > 1)
            {
                std::string newName = getNewName(streamInfo->m_fileName, streamInfo->m_part);
                deleteFile(newName);
                if (rename(streamInfo->m_fileName.c_str(), newName.c_str()) != 0)
                    THROW(ERR_COMMON, "Can't rename file " << streamInfo->m_fileName << " to " << newName)
            }
        }
    }
    return true;
}